

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,string *message)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)message);
  PushTrace(this,file,line,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const std::string& message) {
    PushTrace(file, line, message);
  }